

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__load_and_postprocess_8bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar *__ptr;
  uchar *image;
  int iVar1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  long *in_FS_OFFSET;
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (uchar *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,8);
  if (__ptr == (uchar *)0x0) {
    image = (uchar *)0x0;
  }
  else {
    image = __ptr;
    if (local_3c.bits_per_channel != 8) {
      if (local_3c.bits_per_channel != 0x10) {
        __assert_fail("ri.bits_per_channel == 8 || ri.bits_per_channel == 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                      ,0x4f3,
                      "unsigned char *stbi__load_and_postprocess_8bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
      iVar1 = req_comp;
      if (req_comp == 0) {
        iVar1 = *comp;
      }
      uVar4 = *y * *x * iVar1;
      image = (uchar *)malloc((long)(int)uVar4);
      if (image == (uchar *)0x0) {
        in_FS_OFFSET[-4] = (long)"outofmem";
        image = (uchar *)0x0;
      }
      else {
        if (0 < (int)uVar4) {
          uVar2 = 0;
          do {
            image[uVar2] = __ptr[uVar2 * 2 + 1];
            uVar2 = uVar2 + 1;
          } while (uVar4 != uVar2);
        }
        free(__ptr);
      }
      local_3c.bits_per_channel = 8;
    }
    piVar3 = &stbi__vertically_flip_on_load_global;
    if (*(int *)((long)in_FS_OFFSET + -0x14) != 0) {
      piVar3 = (int *)(*in_FS_OFFSET + -0x18);
    }
    if (*piVar3 != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(image,*x,*y,req_comp);
    }
  }
  return image;
}

Assistant:

static unsigned char *stbi__load_and_postprocess_8bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 8);

   if (result == NULL)
      return NULL;

   // it is the responsibility of the loaders to make sure we get either 8 or 16 bit.
   STBI_ASSERT(ri.bits_per_channel == 8 || ri.bits_per_channel == 16);

   if (ri.bits_per_channel != 8) {
      result = stbi__convert_16_to_8((stbi__uint16 *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 8;
   }

   // @TODO: move stbi__convert_format to here

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi_uc));
   }

   return (unsigned char *) result;
}